

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O1

void __thiscall Buffer::produce(Buffer *this,char c)

{
  undefined7 in_register_00000031;
  ulong uVar1;
  undefined1 local_38 [8];
  unique_lock<std::mutex> lock;
  
  uVar1 = CONCAT71(in_register_00000031,c) & 0xffffffff;
  local_38 = (undefined1  [8])&this->mutex;
  lock._M_device._0_1_ = 0;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_38);
  lock._M_device._0_1_ = 1;
  if (this->position == 9) {
    printf("Producer %c waits (%s)\n",uVar1,"Buffer is full");
    if (this->position == 9) {
      do {
        std::condition_variable::wait((unique_lock *)&this->cond);
      } while (this->position == 9);
    }
    printf("Producer %c produces element after waiting (%s)\n",uVar1,"Buffer is full");
  }
  else {
    printf("Producer %c produces element\n",uVar1);
  }
  this->buffer[this->position] = (char)uVar1;
  this->position = this->position + 1;
  printBuffer(this);
  std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_38);
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_38);
  return;
}

Assistant:

void Buffer::produce(char c) {
    std::unique_lock<std::mutex> lock(mutex);

    if (isFull()) {
        printf("Producer %c waits (%s)\n", c, FULL_CONDITION);

        cond.wait(lock, [this]() { return !isFull(); });

        printf("Producer %c produces element after waiting (%s)\n", c, FULL_CONDITION);
    } else {
        printf("Producer %c produces element\n", c);
    }

    buffer[position] = c;
    ++position;
    printBuffer();

    lock.unlock();
    cond.notify_all();
}